

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5OpenMethod(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCsr)

{
  u64 n;
  int iVar1;
  sqlite3_module *psVar2;
  _func_int_sqlite3_vtab_ptr *p_Var3;
  int iVar4;
  int iVar5;
  sqlite3_vtab_cursor *psVar6;
  sqlite3_vtab_cursor *__s;
  
  psVar2 = pVTab[1].pModule;
  iVar4 = fts5NewTransaction((Fts5FullTable *)pVTab);
  if (iVar4 == 0) {
    iVar1 = *(int *)&psVar2->xBestIndex;
    iVar5 = sqlite3_initialize();
    iVar4 = 7;
    if (iVar5 == 0) {
      n = (long)iVar1 * 4 + 0xb8;
      __s = (sqlite3_vtab_cursor *)sqlite3Malloc(n);
      psVar6 = (sqlite3_vtab_cursor *)0x0;
      if (__s != (sqlite3_vtab_cursor *)0x0) {
        psVar2 = pVTab[2].pModule;
        memset(__s,0,n);
        __s[2].pVtab = (sqlite3_vtab *)(__s + 0x17);
        __s[1].pVtab = (sqlite3_vtab *)psVar2->xNext;
        psVar2->xNext = (_func_int_sqlite3_vtab_cursor_ptr *)__s;
        p_Var3 = psVar2->xDestroy;
        psVar2->xDestroy = p_Var3 + 1;
        __s[3].pVtab = (sqlite3_vtab *)(p_Var3 + 1);
        iVar4 = 0;
        psVar6 = __s;
      }
      goto LAB_001c370d;
    }
  }
  psVar6 = (sqlite3_vtab_cursor *)0x0;
LAB_001c370d:
  *ppCsr = psVar6;
  return iVar4;
}

Assistant:

static int fts5OpenMethod(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCsr){
  Fts5FullTable *pTab = (Fts5FullTable*)pVTab;
  Fts5Config *pConfig = pTab->p.pConfig;
  Fts5Cursor *pCsr = 0;           /* New cursor object */
  sqlite3_int64 nByte;            /* Bytes of space to allocate */
  int rc;                         /* Return code */

  rc = fts5NewTransaction(pTab);
  if( rc==SQLITE_OK ){
    nByte = sizeof(Fts5Cursor) + pConfig->nCol * sizeof(int);
    pCsr = (Fts5Cursor*)sqlite3_malloc64(nByte);
    if( pCsr ){
      Fts5Global *pGlobal = pTab->pGlobal;
      memset(pCsr, 0, (size_t)nByte);
      pCsr->aColumnSize = (int*)&pCsr[1];
      pCsr->pNext = pGlobal->pCsr;
      pGlobal->pCsr = pCsr;
      pCsr->iCsrId = ++pGlobal->iNextId;
    }else{
      rc = SQLITE_NOMEM;
    }
  }
  *ppCsr = (sqlite3_vtab_cursor*)pCsr;
  return rc;
}